

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
google::protobuf::Arena::Create<std::__cxx11::string,std::__cxx11::string_const&>
          (Arena *arena,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  
  if (arena == (Arena *)0x0) {
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
    std::__cxx11::string::string((string *)this,(string *)args);
  }
  else {
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           internal::ThreadSafeArena::AllocateFromStringBlock(&arena->impl_);
    std::__cxx11::string::string((string *)this,(string *)args);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* PROTOBUF_NONNULL
  Create(Arena* PROTOBUF_NULLABLE arena, Args&&... args) {
    if constexpr (is_arena_constructable<T>::value) {
      using Type = std::remove_const_t<T>;
      // DefaultConstruct/CopyConstruct are optimized for messages, which
      // are both arena constructible and destructor skippable and they
      // assume much. Don't use these functions unless the invariants
      // hold.
      if constexpr (is_destructor_skippable<T>::value) {
        constexpr auto construct_type = GetConstructType<T, Args&&...>();
        // We delegate to DefaultConstruct/CopyConstruct where appropriate
        // because protobuf generated classes have external templates for
        // these functions for code size reasons. When `if constexpr` is not
        // available always use the fallback.
        if constexpr (construct_type == ConstructType::kDefault) {
          return static_cast<Type*>(DefaultConstruct<Type>(arena));
        } else if constexpr (construct_type == ConstructType::kCopy) {
          return static_cast<Type*>(CopyConstruct<Type>(arena, &args...));
        }
      }
      return CreateArenaCompatible<Type>(arena, std::forward<Args>(args)...);
    } else {
      if (ABSL_PREDICT_FALSE(arena == nullptr)) {
        return new T(std::forward<Args>(args)...);
      }
      return new (arena->AllocateInternal<T>()) T(std::forward<Args>(args)...);
    }
  }